

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::updateAPF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  int iVar2;
  HFactor *pHVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int i;
  long lVar7;
  ulong uVar8;
  double local_70;
  vector<int,_std::allocator<int>_> *local_68;
  long local_60;
  HFactor *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  pointer local_40;
  pointer local_38;
  
  local_60 = CONCAT44(local_60._4_4_,iRow);
  local_68 = &this->PFindex;
  local_40 = (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38 = (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pvVar1 = &this->PFvalue;
  lVar5 = 0;
  lVar6 = 0;
  local_58 = this;
  for (lVar7 = 0; pHVar3 = local_58, lVar7 < aq->packCount; lVar7 = lVar7 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (local_68,(value_type *)
                        ((long)(aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start + lVar6));
    std::vector<double,_std::allocator<double>_>::push_back
              (pvVar1,(value_type_conflict1 *)
                      ((long)(aq->packValue).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar6 = lVar6 + 4;
    lVar5 = lVar5 + 8;
  }
  local_60 = (long)(int)local_60;
  iVar2 = local_58->baseIndex[local_60];
  local_50 = pvVar1;
  if (iVar2 < local_58->numCol) {
    piVar4 = local_58->Astart;
    lVar6 = (long)piVar4[iVar2];
    lVar5 = lVar6 * 4;
    for (; lVar6 < piVar4[(long)iVar2 + 1]; lVar6 = lVar6 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (local_68,(value_type *)((long)pHVar3->Aindex + lVar5));
      local_70 = -*(double *)((long)pHVar3->Avalue + lVar5 * 2);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_50,&local_70);
      piVar4 = pHVar3->Astart;
      lVar5 = lVar5 + 4;
    }
  }
  else {
    local_70 = (double)CONCAT44(local_70._4_4_,iVar2 - local_58->numCol);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_68,(int *)&local_70);
    local_70 = -1.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(pvVar1,&local_70);
  }
  local_48 = &pHVar3->PFstart;
  local_70 = (double)CONCAT44(local_70._4_4_,
                              (int)((ulong)((long)(pHVar3->PFindex).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pHVar3->PFindex).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_48,(int *)&local_70);
  pvVar1 = local_50;
  lVar5 = 0;
  lVar6 = 0;
  for (lVar7 = 0; pHVar3 = local_58, lVar7 < ep->packCount; lVar7 = lVar7 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (local_68,(value_type *)
                        ((long)(ep->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start + lVar6));
    std::vector<double,_std::allocator<double>_>::push_back
              (pvVar1,(value_type_conflict1 *)
                      ((long)(ep->packValue).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar6 = lVar6 + 4;
    lVar5 = lVar5 + 8;
  }
  uVar8 = (long)local_38 - (long)local_40;
  local_70 = (double)CONCAT44(local_70._4_4_,
                              (int)((ulong)((long)(local_58->PFindex).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_58->PFindex).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_48,(int *)&local_70);
  pHVar3->FtotalX =
       pHVar3->FtotalX +
       ((int)((ulong)((long)(pHVar3->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pHVar3->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) - (int)(uVar8 >> 2));
  std::vector<double,_std::allocator<double>_>::push_back
            (&pHVar3->PFpivotValue,
             (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + local_60);
  return;
}

Assistant:

void HFactor::updateAPF(HVector *aq, HVector *ep, int iRow, int *hint) {
    int PFcountX0 = PFindex.size();

    // Store elements
    for (int i = 0; i < aq->packCount; i++) {
        PFindex.push_back(aq->packIndex[i]);
        PFvalue.push_back(aq->packValue[i]);
    }

    int columnOut = baseIndex[iRow];
    if (columnOut >= numCol) {
        PFindex.push_back(columnOut - numCol);
        PFvalue.push_back(-1);
    } else {
        for (int k = Astart[columnOut]; k < Astart[columnOut + 1]; k++) {
            PFindex.push_back(Aindex[k]);
            PFvalue.push_back(-Avalue[k]);
        }
    }
    PFstart.push_back(PFindex.size());

    for (int i = 0; i < ep->packCount; i++) {
        PFindex.push_back(ep->packIndex[i]);
        PFvalue.push_back(ep->packValue[i]);
    }
    PFstart.push_back(PFindex.size());
    FtotalX += PFindex.size() - PFcountX0;

    // Store pivot
    PFpivotValue.push_back(aq->array[iRow]);

}